

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::AggressiveDCEPass::IsTargetDead(AggressiveDCEPass *this,Instruction *inst)

{
  Op OVar1;
  IRContext *pIVar2;
  bool bVar3;
  uint32_t uVar4;
  Instruction *inst_00;
  bool dead;
  undefined1 local_39;
  _Any_data local_38;
  code *local_28;
  code *pcStack_20;
  
  uVar4 = (inst->has_result_id_ & 1) + 1;
  if (inst->has_type_id_ == false) {
    uVar4 = (uint)inst->has_result_id_;
  }
  uVar4 = Instruction::GetSingleWordOperand(inst,uVar4);
  pIVar2 = (this->super_MemPass).super_Pass.context_;
  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar2);
  }
  inst_00 = analysis::DefUseManager::GetDef
                      ((pIVar2->def_use_mgr_)._M_t.
                       super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                       .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>.
                       _M_head_impl,uVar4);
  OVar1 = inst_00->opcode_;
  if (OVar1 - OpDecorate < 5) {
    if (OVar1 - OpDecorate != 2) {
LAB_00561690:
      __assert_fail("tInst->opcode() == spv::Op::OpDecorationGroup",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp"
                    ,0xb7,"bool spvtools::opt::AggressiveDCEPass::IsTargetDead(Instruction *)");
    }
    local_39 = 1;
    pIVar2 = (this->super_MemPass).super_Pass.context_;
    if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
      IRContext::BuildDefUseManager(pIVar2);
    }
    local_38._8_8_ = 0;
    local_38._M_unused._M_object = &local_39;
    pcStack_20 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:185:43)>
                 ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/aggressive_dead_code_elim_pass.cpp:185:43)>
               ::_M_manager;
    analysis::DefUseManager::ForEachUser
              ((pIVar2->def_use_mgr_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
               .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl,
               inst_00,(function<void_(spvtools::opt::Instruction_*)> *)&local_38);
    if (local_28 != (code *)0x0) {
      (*local_28)(&local_38,&local_38,__destroy_functor);
    }
  }
  else {
    if ((OVar1 - OpDecorateString < 2) || (OVar1 == OpDecorateId)) goto LAB_00561690;
    bVar3 = IsLive(this,inst_00);
    local_39 = !bVar3;
  }
  return (bool)local_39;
}

Assistant:

bool AggressiveDCEPass::IsTargetDead(Instruction* inst) {
  const uint32_t tId = inst->GetSingleWordInOperand(0);
  Instruction* tInst = get_def_use_mgr()->GetDef(tId);
  if (IsAnnotationInst(tInst->opcode())) {
    // This must be a decoration group. We go through annotations in a specific
    // order. So if this is not used by any group or group member decorates, it
    // is dead.
    assert(tInst->opcode() == spv::Op::OpDecorationGroup);
    bool dead = true;
    get_def_use_mgr()->ForEachUser(tInst, [&dead](Instruction* user) {
      if (user->opcode() == spv::Op::OpGroupDecorate ||
          user->opcode() == spv::Op::OpGroupMemberDecorate)
        dead = false;
    });
    return dead;
  }
  return !IsLive(tInst);
}